

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_layer_metas_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,LayerMetas *metas,uint32_t indent)

{
  TypedAttributeWithFallback<tinyusdz::Axis> *pTVar1;
  bool bVar2;
  ostream *poVar3;
  Axis *pAVar4;
  double *pdVar5;
  size_type sVar6;
  string *s;
  bool *pbVar7;
  PlaybackMode *pPVar8;
  size_type sVar9;
  bool v_00;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  Axis v_01;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t n_04;
  uint32_t n_05;
  uint32_t n_06;
  uint32_t n_07;
  uint32_t n_08;
  StringData *v_02;
  StringData *v_03;
  undefined1 auVar10 [12];
  allocator local_4c1;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  PlaybackMode local_3fc;
  undefined1 local_3f8 [4];
  PlaybackMode v;
  string local_3d8;
  allocator local_3b1;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream meta_ss;
  ostream aoStack_198 [380];
  uint local_1c;
  TypedAttributeWithFallback<tinyusdz::Axis> *pTStack_18;
  uint32_t indent_local;
  LayerMetas *metas_local;
  
  local_1c = (uint)metas;
  pTStack_18 = (TypedAttributeWithFallback<tinyusdz::Axis> *)this;
  metas_local = (LayerMetas *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  auVar10 = std::__cxx11::string::empty();
  if ((auVar10 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
    pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,auVar10._8_4_);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_1c8);
    poVar3 = std::operator<<(poVar3,"doc = ");
    to_string_abi_cxx11_
              (&local_1e8,(tinyusdz *)((long)&pTStack_18[6]._metas.connectability.contained + 0x18),
               v_02);
    poVar3 = std::operator<<(poVar3,(string *)&local_1e8);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  bVar2 = TypedAttributeWithFallback<double>::authored
                    ((TypedAttributeWithFallback<double> *)&pTStack_18[1]._metas.comment.contained);
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_208);
    poVar3 = std::operator<<(poVar3,"metersPerUnit = ");
    pdVar5 = TypedAttributeWithFallback<double>::get_value
                       ((TypedAttributeWithFallback<double> *)
                        &pTStack_18[1]._metas.comment.contained);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar5);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_208);
  }
  bVar2 = TypedAttributeWithFallback<double>::authored
                    ((TypedAttributeWithFallback<double> *)&pTStack_18[6]._metas.renderType);
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_228,(pprint *)(ulong)local_1c,n_00);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_228);
    poVar3 = std::operator<<(poVar3,"kilogramsPerUnit = ");
    pdVar5 = TypedAttributeWithFallback<double>::get_value
                       ((TypedAttributeWithFallback<double> *)&pTStack_18[6]._metas.renderType);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar5);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_228);
  }
  bVar2 = TypedAttributeWithFallback<tinyusdz::Axis>::authored(pTStack_18);
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_248);
    poVar3 = std::operator<<(poVar3,"upAxis = ");
    pAVar4 = TypedAttributeWithFallback<tinyusdz::Axis>::get_value(pTStack_18);
    to_string_abi_cxx11_(&local_288,(tinyusdz *)(ulong)*pAVar4,v_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a8,"\"",&local_2a9);
    quote(&local_268,&local_288,&local_2a8);
    poVar3 = std::operator<<(poVar3,(string *)&local_268);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_248);
  }
  bVar2 = TypedAttributeWithFallback<double>::authored
                    ((TypedAttributeWithFallback<double> *)
                     ((long)&pTStack_18[2]._metas.comment.contained + 0x10));
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_2d0,(pprint *)(ulong)local_1c,n_02);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_2d0);
    poVar3 = std::operator<<(poVar3,"timeCodesPerSecond = ");
    pdVar5 = TypedAttributeWithFallback<double>::get_value
                       ((TypedAttributeWithFallback<double> *)
                        ((long)&pTStack_18[2]._metas.comment.contained + 0x10));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar5);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  bVar2 = TypedAttributeWithFallback<double>::authored
                    ((TypedAttributeWithFallback<double> *)&pTStack_18[4]._metas.customData);
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_2f0,(pprint *)(ulong)local_1c,n_03);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_2f0);
    poVar3 = std::operator<<(poVar3,"startTimeCode = ");
    pdVar5 = TypedAttributeWithFallback<double>::get_value
                       ((TypedAttributeWithFallback<double> *)&pTStack_18[4]._metas.customData);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar5);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  bVar2 = TypedAttributeWithFallback<double>::authored
                    ((TypedAttributeWithFallback<double> *)
                     ((long)&pTStack_18[5]._metas.customData.contained + 8));
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_310,(pprint *)(ulong)local_1c,n_04);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_310);
    poVar3 = std::operator<<(poVar3,"endTimeCode = ");
    pdVar5 = TypedAttributeWithFallback<double>::get_value
                       ((TypedAttributeWithFallback<double> *)
                        ((long)&pTStack_18[5]._metas.customData.contained + 8));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar5);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_310);
  }
  bVar2 = TypedAttributeWithFallback<double>::authored
                    ((TypedAttributeWithFallback<double> *)
                     ((long)&pTStack_18[3]._metas.comment.contained + 0x20));
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_330,(pprint *)(ulong)local_1c,n_05);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_330);
    poVar3 = std::operator<<(poVar3,"framesPerSecond = ");
    pdVar5 = TypedAttributeWithFallback<double>::get_value
                       ((TypedAttributeWithFallback<double> *)
                        ((long)&pTStack_18[3]._metas.comment.contained + 0x20));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar5);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_330);
  }
  sVar6 = std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::size
                    ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)
                     ((long)&pTStack_18[6]._metas.customData.contained + 0x18));
  if (sVar6 != 0) {
    pprint::Indent_abi_cxx11_(&local_350,(pprint *)(ulong)local_1c,n_06);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_350);
    poVar3 = std::operator<<(poVar3,"subLayers = ");
    poVar3 = std::operator<<(poVar3,(vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>
                                     *)((long)&pTStack_18[6]._metas.customData.contained + 0x18));
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_350);
  }
  Token::str_abi_cxx11_((Token *)(pTStack_18 + 1));
  auVar10 = std::__cxx11::string::size();
  if (auVar10._0_8_ != 0) {
    pprint::Indent_abi_cxx11_(&local_370,(pprint *)0x1,auVar10._8_4_);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_370);
    poVar3 = std::operator<<(poVar3,"defaultPrim = ");
    s = Token::str_abi_cxx11_((Token *)(pTStack_18 + 1));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b0,"\"",&local_3b1);
    quote(&local_390,s,&local_3b0);
    poVar3 = std::operator<<(poVar3,(string *)&local_390);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    std::__cxx11::string::~string((string *)&local_370);
  }
  bVar2 = TypedAttributeWithFallback<bool>::authored
                    ((TypedAttributeWithFallback<bool> *)
                     ((long)&pTStack_18[7]._metas.sdrMetadata.contained + 0x10));
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_3d8,(pprint *)0x1,n_07);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_3d8);
    poVar3 = std::operator<<(poVar3,"autoPlay = ");
    pbVar7 = TypedAttributeWithFallback<bool>::get_value
                       ((TypedAttributeWithFallback<bool> *)
                        ((long)&pTStack_18[7]._metas.sdrMetadata.contained + 0x10));
    to_string_abi_cxx11_((string *)local_3f8,(tinyusdz *)(ulong)(*pbVar7 & 1),v_00);
    poVar3 = std::operator<<(poVar3,(string *)local_3f8);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)local_3f8);
    std::__cxx11::string::~string((string *)&local_3d8);
  }
  bVar2 = TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode>::authored
                    ((TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode> *)
                     &pTStack_18[8]._metas.sdrMetadata.contained);
  if (bVar2) {
    pPVar8 = TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode>::get_value
                       ((TypedAttributeWithFallback<tinyusdz::LayerMetas::PlaybackMode> *)
                        &pTStack_18[8]._metas.sdrMetadata.contained);
    local_3fc = *pPVar8;
    if (local_3fc == PlaybackModeLoop) {
      pprint::Indent_abi_cxx11_(&local_420,(pprint *)(ulong)local_1c,n_08);
      poVar3 = std::operator<<(aoStack_198,(string *)&local_420);
      std::operator<<(poVar3,"playbackMode = \"loop\"\n");
      std::__cxx11::string::~string((string *)&local_420);
    }
    else {
      pprint::Indent_abi_cxx11_(&local_440,(pprint *)(ulong)local_1c,n_08);
      poVar3 = std::operator<<(aoStack_198,(string *)&local_440);
      std::operator<<(poVar3,"playbackMode = \"none\"\n");
      std::__cxx11::string::~string((string *)&local_440);
    }
  }
  auVar10 = std::__cxx11::string::empty();
  if ((auVar10 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
    pprint::Indent_abi_cxx11_(&local_460,(pprint *)(ulong)local_1c,auVar10._8_4_);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_460);
    to_string_abi_cxx11_(&local_480,(tinyusdz *)&pTStack_18[6]._metas.weight,v_03);
    poVar3 = std::operator<<(poVar3,(string *)&local_480);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_460);
  }
  sVar9 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                  *)((long)&pTStack_18[7]._metas.renderType.contained + 8));
  if (sVar9 != 0) {
    pTVar1 = pTStack_18 + 7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4c0,"customLayerData",&local_4c1);
    print_customData(&local_4a0,(CustomDataType *)((long)&(pTVar1->_metas).renderType.contained + 8)
                     ,&local_4c0,1);
    std::operator<<(aoStack_198,(string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_layer_metas(const LayerMetas &metas, const uint32_t indent) {
  std::stringstream meta_ss;

  if (metas.doc.value.empty()) {
    // ss << pprint::Indent(1) << "doc = \"Exporterd from TinyUSDZ v" <<
    // tinyusdz::version_major
    //    << "." << tinyusdz::version_minor << "." << tinyusdz::version_micro
    //    << tinyusdz::version_rev << "\"\n";
  } else {
    meta_ss << pprint::Indent(indent) << "doc = " << to_string(metas.doc)
            << "\n";
  }

  if (metas.metersPerUnit.authored()) {
    meta_ss << pprint::Indent(indent)
            << "metersPerUnit = " << metas.metersPerUnit.get_value() << "\n";
  }

  if (metas.kilogramsPerUnit.authored()) {
    meta_ss << pprint::Indent(indent)
            << "kilogramsPerUnit = " << metas.kilogramsPerUnit.get_value() << "\n";
  }

  if (metas.upAxis.authored()) {
    meta_ss << pprint::Indent(indent)
            << "upAxis = " << quote(to_string(metas.upAxis.get_value()))
            << "\n";
  }

  if (metas.timeCodesPerSecond.authored()) {
    meta_ss << pprint::Indent(indent)
            << "timeCodesPerSecond = " << metas.timeCodesPerSecond.get_value()
            << "\n";
  }

  if (metas.startTimeCode.authored()) {
    meta_ss << pprint::Indent(indent)
            << "startTimeCode = " << metas.startTimeCode.get_value() << "\n";
  }

  if (metas.endTimeCode.authored()) {
    meta_ss << pprint::Indent(indent)
            << "endTimeCode = " << metas.endTimeCode.get_value() << "\n";
  }

  if (metas.framesPerSecond.authored()) {
    meta_ss << pprint::Indent(indent)
            << "framesPerSecond = " << metas.framesPerSecond.get_value()
            << "\n";
  }

  // TODO: Do not print subLayers when consumed(after composition evaluated)
  if (metas.subLayers.size()) {
    meta_ss << pprint::Indent(indent) << "subLayers = " << metas.subLayers
            << "\n";
  }

  if (metas.defaultPrim.str().size()) {
    meta_ss << pprint::Indent(1)
            << "defaultPrim = " << tinyusdz::quote(metas.defaultPrim.str())
            << "\n";
  }

  if (metas.autoPlay.authored()) {
    meta_ss << pprint::Indent(1)
            << "autoPlay = " << to_string(metas.autoPlay.get_value()) << "\n";
  }

  if (metas.playbackMode.authored()) {
    auto v = metas.playbackMode.get_value();
    if (v == LayerMetas::PlaybackMode::PlaybackModeLoop) {
      meta_ss << pprint::Indent(indent) << "playbackMode = \"loop\"\n";
    } else {  // None
      meta_ss << pprint::Indent(indent) << "playbackMode = \"none\"\n";
    }
  }

  if (!metas.comment.value.empty()) {
    // Stage meta omits 'comment'
    meta_ss << pprint::Indent(indent) << to_string(metas.comment) << "\n";
  }

  if (metas.customLayerData.size()) {
    meta_ss << print_customData(metas.customLayerData, "customLayerData",
                                /* indent */ 1);
  }

  return meta_ss.str();
}